

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

String * __thiscall
Json::valueToString_abi_cxx11_(String *__return_storage_ptr__,Json *this,LargestInt value)

{
  char *pcVar1;
  UIntToStringBuffer buffer;
  allocator<char> local_41;
  char *local_40;
  char local_38 [25];
  char local_1f [15];
  
  local_40 = local_1f;
  if ((long)this < 0) {
    uintToString(-(long)this,&local_40);
    pcVar1 = local_40;
    local_40[-1] = '-';
    pcVar1 = pcVar1 + -1;
  }
  else {
    uintToString((LargestUInt)this,&local_40);
    pcVar1 = local_40;
  }
  if (pcVar1 < local_38) {
    __assert_fail("current >= buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/springkim[P]cip/src/jsoncpp.cpp"
                  ,0x1030,"String Json::valueToString(LargestInt)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar1,&local_41);
  return __return_storage_ptr__;
}

Assistant:

String valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  if (value == Value::minLargestInt) {
    uintToString(LargestUInt(Value::maxLargestInt) + 1, current);
    *--current = '-';
  } else if (value < 0) {
    uintToString(LargestUInt(-value), current);
    *--current = '-';
  } else {
    uintToString(LargestUInt(value), current);
  }
  assert(current >= buffer);
  return current;
}